

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

TriggerStep * triggerStepAllocate(Parse *pParse,u8 op,Token *pName,char *zStart,char *zEnd)

{
  sqlite3 *db;
  uint uVar1;
  undefined4 uVar2;
  TriggerStep *pTVar3;
  char *pcVar4;
  RenameToken *pRVar5;
  TriggerStep *z;
  
  db = pParse->db;
  pTVar3 = (TriggerStep *)sqlite3DbMallocZero(db,(ulong)pName->n + 0x59);
  if (pTVar3 != (TriggerStep *)0x0) {
    z = pTVar3 + 1;
    memcpy(z,pName->z,(ulong)pName->n);
    sqlite3Dequote((char *)z);
    pTVar3->zTarget = (char *)z;
    pTVar3->op = op;
    pcVar4 = triggerSpanDup(db,zStart,zEnd);
    pTVar3->zSpan = pcVar4;
    if (1 < pParse->eParseMode) {
      pcVar4 = pTVar3->zTarget;
      pRVar5 = (RenameToken *)sqlite3DbMallocZero(pParse->db,0x20);
      if (pRVar5 != (RenameToken *)0x0) {
        pRVar5->p = pcVar4;
        uVar1 = pName->n;
        uVar2 = *(undefined4 *)&pName->field_0xc;
        (pRVar5->t).z = pName->z;
        (pRVar5->t).n = uVar1;
        *(undefined4 *)&(pRVar5->t).field_0xc = uVar2;
        pRVar5->pNext = pParse->pRename;
        pParse->pRename = pRVar5;
      }
    }
  }
  return pTVar3;
}

Assistant:

static TriggerStep *triggerStepAllocate(
  Parse *pParse,              /* Parser context */
  u8 op,                      /* Trigger opcode */
  Token *pName,               /* The target name */
  const char *zStart,         /* Start of SQL text */
  const char *zEnd            /* End of SQL text */
){
  sqlite3 *db = pParse->db;
  TriggerStep *pTriggerStep;

  pTriggerStep = sqlite3DbMallocZero(db, sizeof(TriggerStep) + pName->n + 1);
  if( pTriggerStep ){
    char *z = (char*)&pTriggerStep[1];
    memcpy(z, pName->z, pName->n);
    sqlite3Dequote(z);
    pTriggerStep->zTarget = z;
    pTriggerStep->op = op;
    pTriggerStep->zSpan = triggerSpanDup(db, zStart, zEnd);
    if( IN_RENAME_OBJECT ){
      sqlite3RenameTokenMap(pParse, pTriggerStep->zTarget, pName);
    }
  }
  return pTriggerStep;
}